

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.h
# Opt level: O2

int32_t icu_63::CollationBuilder::indexFromTempCE(int64_t tempCE)

{
  uint uVar1;
  
  uVar1 = (uint)((ulong)(tempCE + -0x4040000006002000) >> 0x20);
  return (uint)((ulong)(tempCE + -0x4040000006002000) >> 0x18) & 0x3f |
         uVar1 >> 10 & 0x1fc0 | uVar1 >> 0xb & 0xfe000;
}

Assistant:

static inline int32_t indexFromTempCE(int64_t tempCE) {
        tempCE -= INT64_C(0x4040000006002000);
        return
            ((int32_t)(tempCE >> 43) & 0xfe000) |
            ((int32_t)(tempCE >> 42) & 0x1fc0) |
            ((int32_t)(tempCE >> 24) & 0x3f);
    }